

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O0

HashWriter * TaggedHash(string *tag)

{
  HashWriter *this;
  CSHA256 *pCVar1;
  CSHA256 *in_RSI;
  CSHA256 *in_RDI;
  long in_FS_OFFSET;
  HashWriter *writer;
  uint256 taghash;
  uint256 *obj;
  uchar *data;
  uint256 local_90 [3];
  uchar local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->buf[0x30] = '\0';
  in_RDI->buf[0x31] = '\0';
  in_RDI->buf[0x32] = '\0';
  in_RDI->buf[0x33] = '\0';
  in_RDI->buf[0x34] = '\0';
  in_RDI->buf[0x35] = '\0';
  in_RDI->buf[0x36] = '\0';
  in_RDI->buf[0x37] = '\0';
  in_RDI->buf[0x38] = '\0';
  in_RDI->buf[0x39] = '\0';
  in_RDI->buf[0x3a] = '\0';
  in_RDI->buf[0x3b] = '\0';
  in_RDI->buf[0x3c] = '\0';
  in_RDI->buf[0x3d] = '\0';
  in_RDI->buf[0x3e] = '\0';
  in_RDI->buf[0x3f] = '\0';
  in_RDI->buf[0x20] = '\0';
  in_RDI->buf[0x21] = '\0';
  in_RDI->buf[0x22] = '\0';
  in_RDI->buf[0x23] = '\0';
  in_RDI->buf[0x24] = '\0';
  in_RDI->buf[0x25] = '\0';
  in_RDI->buf[0x26] = '\0';
  in_RDI->buf[0x27] = '\0';
  in_RDI->buf[0x28] = '\0';
  in_RDI->buf[0x29] = '\0';
  in_RDI->buf[0x2a] = '\0';
  in_RDI->buf[0x2b] = '\0';
  in_RDI->buf[0x2c] = '\0';
  in_RDI->buf[0x2d] = '\0';
  in_RDI->buf[0x2e] = '\0';
  in_RDI->buf[0x2f] = '\0';
  in_RDI->buf[0x10] = '\0';
  in_RDI->buf[0x11] = '\0';
  in_RDI->buf[0x12] = '\0';
  in_RDI->buf[0x13] = '\0';
  in_RDI->buf[0x14] = '\0';
  in_RDI->buf[0x15] = '\0';
  in_RDI->buf[0x16] = '\0';
  in_RDI->buf[0x17] = '\0';
  in_RDI->buf[0x18] = '\0';
  in_RDI->buf[0x19] = '\0';
  in_RDI->buf[0x1a] = '\0';
  in_RDI->buf[0x1b] = '\0';
  in_RDI->buf[0x1c] = '\0';
  in_RDI->buf[0x1d] = '\0';
  in_RDI->buf[0x1e] = '\0';
  in_RDI->buf[0x1f] = '\0';
  in_RDI->buf[0] = '\0';
  in_RDI->buf[1] = '\0';
  in_RDI->buf[2] = '\0';
  in_RDI->buf[3] = '\0';
  in_RDI->buf[4] = '\0';
  in_RDI->buf[5] = '\0';
  in_RDI->buf[6] = '\0';
  in_RDI->buf[7] = '\0';
  in_RDI->buf[8] = '\0';
  in_RDI->buf[9] = '\0';
  in_RDI->buf[10] = '\0';
  in_RDI->buf[0xb] = '\0';
  in_RDI->buf[0xc] = '\0';
  in_RDI->buf[0xd] = '\0';
  in_RDI->buf[0xe] = '\0';
  in_RDI->buf[0xf] = '\0';
  in_RDI->s[4] = 0;
  in_RDI->s[5] = 0;
  in_RDI->s[6] = 0;
  in_RDI->s[7] = 0;
  in_RDI->s[0] = 0;
  in_RDI->s[1] = 0;
  in_RDI->s[2] = 0;
  in_RDI->s[3] = 0;
  in_RDI->bytes = 0;
  pCVar1 = in_RDI;
  HashWriter::HashWriter((HashWriter *)in_RDI);
  data = local_28;
  uint256::uint256((uint256 *)in_RDI);
  obj = local_90;
  CSHA256::CSHA256(in_RDI);
  this = (HashWriter *)
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  pCVar1 = CSHA256::Write(in_RSI,data,(size_t)pCVar1);
  base_blob<256U>::begin((base_blob<256U> *)in_RDI);
  CSHA256::Finalize(pCVar1,(uchar *)this);
  HashWriter::operator<<(this,obj);
  HashWriter::operator<<(this,obj);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (HashWriter *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

HashWriter TaggedHash(const std::string& tag)
{
    HashWriter writer{};
    uint256 taghash;
    CSHA256().Write((const unsigned char*)tag.data(), tag.size()).Finalize(taghash.begin());
    writer << taghash << taghash;
    return writer;
}